

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
ExpressionLhs<const_kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::sibling_iterator_&>
::endExpression(ExpressionLhs<const_kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::sibling_iterator_&>
                *this)

{
  ResultBuilder *pRVar1;
  bool value_00;
  string local_38;
  byte local_11;
  ExpressionLhs<const_kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::sibling_iterator_&>
  *pEStack_10;
  bool value;
  ExpressionLhs<const_kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::sibling_iterator_&>
  *this_local;
  
  pEStack_10 = this;
  local_11 = kp::tree::iterator_base::operator_cast_to_bool((iterator_base *)this->m_lhs);
  pRVar1 = this->m_rb;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)local_11,value_00);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,(bool)(local_11 & 1));
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }